

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_create_response_string(void)

{
  header_dict *m;
  char **value;
  int iVar1;
  char data [1000];
  HttpResponse local_2750;
  
  local_2750.status_code = 200;
  memcpy(local_2750.data,"<html><h1>Kek</h1></html>",10000);
  m = &local_2750.headers;
  local_2750.headers.ref = (char **)0x0;
  local_2750.headers.base.buckets = (map_node_t **)0x0;
  local_2750.headers.base.nbuckets = 0;
  local_2750.headers.base.nnodes = 0;
  value = &local_2750.headers.tmp;
  local_2750.headers.tmp = "X-Frontend";
  map_set_(&m->base,"access-control-expose-headers",value,8);
  local_2750.headers.tmp = "no-store";
  map_set_(&m->base,"cache-control",value,8);
  local_2750.headers.tmp = "gzip";
  map_set_(&m->base,"content-encoding",value,8);
  local_2750.headers.tmp = "text/html; charset=windows-1251";
  map_set_(&m->base,"content-type",value,8);
  parse_resp_to_str(&local_2750,data);
  iVar1 = strcmp(data,TEST_RESP1);
  test_check_((uint)(iVar1 == 0),
              "/workspace/llm4binary/github/license_all_cmakelists_1510/RedMoon32[P]ShabeFramework/tests/tests.c"
              ,0x5f,"%s","strcmp(data, TEST_RESP1) == 0");
  test_message_("Expected: %s\n\n",TEST_RESP1);
  test_message_("Produced: %s\n\n",data);
  map_deinit_(&m->base);
  return;
}

Assistant:

void test_create_response_string(void) {

    HttpResponse resp;
    resp = (HttpResponse) {.status_code = 200, .data = "<html><h1>Kek</h1></html>"};
    map_init(&resp.headers);
    map_set(&resp.headers, "access-control-expose-headers", "X-Frontend");
    map_set(&resp.headers, "cache-control", "no-store");
    map_set(&resp.headers, "content-encoding", "gzip");
    map_set(&resp.headers, "content-type", "text/html; charset=windows-1251");
    char data[MAX_REQUEST_LENGTH];
    parse_resp_to_str(&resp, data);
    TEST_CHECK(strcmp(data, TEST_RESP1) == 0);
    TEST_MSG("Expected: %s\n\n", TEST_RESP1);
    TEST_MSG("Produced: %s\n\n", data);

    map_deinit(&resp.headers);
}